

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool duckdb_miniz::mz_zip_reader_locate_file_v2
                  (mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags,mz_uint32 *pIndex)

{
  byte bVar1;
  ushort uVar2;
  mz_zip_internal_state *pmVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  mz_zip_error mVar13;
  uint uVar14;
  ulong __n;
  byte bVar15;
  void *__s2;
  ulong uVar16;
  int iVar17;
  byte *pbVar18;
  byte *pbVar19;
  int iVar20;
  ulong uVar21;
  byte *pbVar22;
  byte bVar23;
  long lVar24;
  mz_zip_internal_state *pState;
  bool bVar25;
  bool bVar26;
  
  if (pIndex != (mz_uint32 *)0x0) {
    *pIndex = 0;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar3 = pZip->m_pState;
  if (pName == (char *)0x0 || pmVar3 == (mz_zip_internal_state *)0x0) {
    mVar13 = MZ_ZIP_INVALID_PARAMETER;
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    goto LAB_01cecc36;
  }
  if (((((pmVar3->m_init_flags & 0x800) == 0) && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) &&
      (pComment == (char *)0x0 && (flags & 0x300) == 0)) &&
     ((pmVar3->m_sorted_central_dir_offsets).m_size != 0)) {
    pvVar4 = (pmVar3->m_sorted_central_dir_offsets).m_p;
    uVar14 = pZip->m_total_files;
    sVar6 = strlen(pName);
    if (pIndex != (mz_uint32 *)0x0) {
      *pIndex = 0;
    }
    mVar13 = MZ_ZIP_FILE_NOT_FOUND;
    if ((ulong)uVar14 == 0) goto LAB_01cecc36;
    lVar10 = 0;
    lVar24 = (ulong)uVar14 - 1;
    while (lVar10 <= lVar24) {
      uVar11 = (lVar24 - lVar10 >> 1) + lVar10;
      uVar14 = *(uint *)((long)pvVar4 + (uVar11 & 0xffffffff) * 4);
      pvVar5 = (pmVar3->m_central_dir).m_p;
      uVar9 = (ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)uVar14 * 4);
      pbVar18 = (byte *)((long)pvVar5 + uVar9 + 0x2e);
      uVar2 = *(ushort *)(pbVar18 + -0x12);
      uVar21 = (ulong)uVar2;
      if ((uint)sVar6 <= (uint)uVar2) {
        uVar21 = sVar6 & 0xffffffff;
      }
      pbVar19 = (byte *)((long)pvVar5 + uVar21 + uVar9 + 0x2e);
      pbVar22 = (byte *)pName;
      if ((int)uVar21 == 0) {
        iVar20 = 0;
      }
      else {
        do {
          bVar1 = *pbVar18;
          bVar23 = bVar1 + 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar23 = bVar1;
          }
          bVar1 = *pbVar22;
          bVar15 = bVar1 + 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar15 = bVar1;
          }
          if (bVar23 != bVar15) break;
          pbVar18 = pbVar18 + 1;
          pbVar22 = pbVar22 + 1;
        } while (pbVar18 < pbVar19);
        iVar20 = (uint)bVar23 - (uint)bVar15;
      }
      if (pbVar18 == pbVar19) {
        iVar20 = (uint)uVar2 - (uint)sVar6;
      }
      lVar12 = lVar24;
      if (iVar20 == 0) {
        if (pIndex != (mz_uint32 *)0x0) {
          *pIndex = uVar14;
        }
      }
      else {
        lVar12 = uVar11 - 1;
        if (iVar20 < 0) {
          lVar10 = uVar11 + 1;
          lVar12 = lVar24;
        }
      }
      lVar24 = lVar12;
      if (iVar20 == 0) {
        return 1;
      }
    }
  }
  else {
    sVar6 = strlen(pName);
    mVar13 = MZ_ZIP_INVALID_PARAMETER;
    if (0xffff < sVar6) goto LAB_01cecc36;
    if (pComment == (char *)0x0) {
      sVar7 = 0;
    }
    else {
      sVar7 = strlen(pComment);
    }
    mVar13 = MZ_ZIP_INVALID_PARAMETER;
    if ((0xffff < sVar7) || (mVar13 = MZ_ZIP_FILE_NOT_FOUND, pZip->m_total_files == 0))
    goto LAB_01cecc36;
    pvVar4 = (pmVar3->m_central_dir).m_p;
    pvVar5 = (pmVar3->m_central_dir_offsets).m_p;
    uVar11 = 0;
    do {
      uVar21 = (ulong)*(uint *)((long)pvVar5 + uVar11 * 4);
      uVar2 = *(ushort *)((long)pvVar4 + uVar21 + 0x1c);
      uVar9 = (ulong)uVar2;
      bVar26 = false;
      if (sVar6 <= uVar9) {
        __s2 = (void *)((long)pvVar4 + uVar21 + 0x2e);
        if (sVar7 != 0) {
          __n = (ulong)*(ushort *)((long)pvVar4 + uVar21 + 0x20);
          if (sVar7 == __n) {
            uVar16 = (ulong)*(byte *)((long)pvVar4 + uVar21 + 0x1f) * 0x100;
            uVar8 = (ulong)*(byte *)((long)pvVar4 + uVar21 + 0x1e);
            if ((flags >> 8 & 1) == 0) {
              if (__n == 0) {
                bVar25 = false;
              }
              else {
                lVar10 = 0;
                do {
                  bVar1 = pComment[lVar10];
                  iVar20 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    iVar20 = (int)(char)bVar1;
                  }
                  bVar1 = *(byte *)((long)pvVar4 + lVar10 + uVar16 + uVar21 + uVar8 + uVar9 + 0x2e);
                  iVar17 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    iVar17 = (int)(char)bVar1;
                  }
                  bVar25 = iVar20 != iVar17;
                } while ((!bVar25) && (bVar26 = __n - 1 != lVar10, lVar10 = lVar10 + 1, bVar26));
              }
            }
            else {
              iVar20 = bcmp(pComment,(void *)((long)__s2 + uVar9 + (uVar16 | uVar8)),__n);
              bVar25 = iVar20 != 0;
            }
            bVar25 = (bool)(bVar25 ^ 1);
          }
          else {
            bVar25 = false;
          }
          bVar26 = false;
          if (!bVar25) goto LAB_01cecc1e;
        }
        if (((flags >> 9 & 1) != 0) && (uVar2 != 0)) {
          do {
            uVar14 = *(byte *)((long)__s2 + (uVar9 - 1 & 0xffffffff)) - 0x2f;
            if ((uVar14 < 0x2e) && ((0x200000000801U >> ((ulong)uVar14 & 0x3f) & 1) != 0))
            goto LAB_01cecb47;
            bVar26 = 1 < (long)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar26);
          uVar9 = 0;
LAB_01cecb47:
          __s2 = (void *)((long)__s2 + (uVar9 & 0xffffffff));
          uVar9 = (ulong)((uint)uVar2 - (int)uVar9);
        }
        bVar26 = false;
        if (sVar6 == uVar9) {
          if ((flags >> 8 & 1) == 0) {
            if (uVar9 == 0) {
              bVar25 = false;
            }
            else {
              lVar10 = 0;
              do {
                bVar1 = pName[lVar10];
                iVar20 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  iVar20 = (int)(char)bVar1;
                }
                bVar1 = *(byte *)((long)__s2 + lVar10);
                iVar17 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  iVar17 = (int)(char)bVar1;
                }
                bVar25 = iVar20 != iVar17;
              } while ((!bVar25) && (bVar26 = uVar9 - 1 != lVar10, lVar10 = lVar10 + 1, bVar26));
            }
          }
          else {
            iVar20 = bcmp(pName,__s2,uVar9);
            bVar25 = iVar20 != 0;
          }
          bVar26 = (bool)(bVar25 ^ 1);
          if ((pIndex != (mz_uint32 *)0x0) && (!bVar25)) {
            *pIndex = (mz_uint32)uVar11;
            bVar26 = true;
          }
        }
      }
LAB_01cecc1e:
      if (bVar26) {
        return 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < pZip->m_total_files);
  }
  mVar13 = MZ_ZIP_FILE_NOT_FOUND;
LAB_01cecc36:
  pZip->m_last_error = mVar13;
  return 0;
}

Assistant:

mz_bool mz_zip_reader_locate_file_v2(mz_zip_archive *pZip, const char *pName, const char *pComment, mz_uint flags, mz_uint32 *pIndex)
{
    mz_uint file_index;
    size_t name_len, comment_len;

    if (pIndex)
        *pIndex = 0;

    if ((!pZip) || (!pZip->m_pState) || (!pName))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* See if we can use a binary search */
    if (((pZip->m_pState->m_init_flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0) &&
        (pZip->m_zip_mode == MZ_ZIP_MODE_READING) &&
        ((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size))
    {
        return mz_zip_locate_file_binary_search(pZip, pName, pIndex);
    }

    /* Locate the entry by scanning the entire central directory */
    name_len = strlen(pName);
    if (name_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    comment_len = pComment ? strlen(pComment) : 0;
    if (comment_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    for (file_index = 0; file_index < pZip->m_total_files; file_index++)
    {
        const mz_uint8 *pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir, mz_uint8, MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index));
        mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
        const char *pFilename = (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
        if (filename_len < name_len)
            continue;
        if (comment_len)
        {
            mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
            const char *pFile_comment = pFilename + filename_len + file_extra_len;
            if ((file_comment_len != comment_len) || (!mz_zip_string_equal(pComment, pFile_comment, file_comment_len, flags)))
                continue;
        }
        if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len))
        {
            int ofs = filename_len - 1;
            do
            {
                if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
                    break;
            } while (--ofs >= 0);
            ofs++;
            pFilename += ofs;
            filename_len -= ofs;
        }
        if ((filename_len == name_len) && (mz_zip_string_equal(pName, pFilename, filename_len, flags)))
        {
            if (pIndex)
                *pIndex = file_index;
            return MZ_TRUE;
        }
    }

    return mz_zip_set_error(pZip, MZ_ZIP_FILE_NOT_FOUND);
}